

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVariableReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::EnvironmentVariableReporter::report
          (EnvironmentVariableReporter *this,string *received,string *approved)

{
  bool bVar1;
  char *in_RSI;
  string envVar;
  string envVarName;
  string *in_stack_00000098;
  string *in_stack_000000a0;
  EnvironmentVariableReporter *in_stack_000000a8;
  string local_58 [32];
  string local_38 [56];
  
  environmentVariableName_abi_cxx11_();
  ::std::__cxx11::string::c_str();
  SystemUtils::safeGetEnv_abi_cxx11_(in_RSI);
  bVar1 = report(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,(string *)this);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_38);
  return bVar1;
}

Assistant:

bool EnvironmentVariableReporter::report(std::string received,
                                             std::string approved) const
    {
        // Get the env var
        const auto envVarName = environmentVariableName();
        const auto envVar = SystemUtils::safeGetEnv(envVarName.c_str());
        return report(envVar, received, approved);
    }